

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

Normalizer2 * icu_63::Normalizer2Factory::getInstance(UNormalizationMode mode,UErrorCode *errorCode)

{
  Normalizer2 *pNVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    switch(mode) {
    case UNORM_NFD:
      pNVar1 = Normalizer2::getNFDInstance(errorCode);
      return pNVar1;
    case UNORM_NFKD:
      pNVar1 = Normalizer2::getNFKDInstance(errorCode);
      return pNVar1;
    case UNORM_DEFAULT:
      pNVar1 = Normalizer2::getNFCInstance(errorCode);
      return pNVar1;
    case UNORM_NFKC:
      pNVar1 = Normalizer2::getNFKCInstance(errorCode);
      return pNVar1;
    case UNORM_FCD:
      pNVar1 = getFCDInstance(errorCode);
      return pNVar1;
    default:
      pNVar1 = getNoopInstance(errorCode);
      return pNVar1;
    }
  }
  return (Normalizer2 *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }